

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

TlsCertificate * __thiscall
kj::TlsCertificate::operator=(TlsCertificate *this,TlsCertificate *other)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  TlsCertificate *other_local;
  TlsCertificate *this_local;
  
  ___begin1 = indices<void*(&)[10]>(this->chain);
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  do {
    bVar2 = Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return this;
    }
    puVar3 = Range<unsigned_long>::Iterator::operator*(&__end1);
    uVar1 = *puVar3;
    if (this->chain[uVar1] == other->chain[uVar1]) {
      if (this->chain[uVar1] == (void *)0x0) {
        return this;
      }
    }
    else {
      EVP_PKEY_free((EVP_PKEY *)this->chain[uVar1]);
      this->chain[uVar1] = other->chain[uVar1];
      if (this->chain[uVar1] != (void *)0x0) {
        X509_up_ref(this->chain[uVar1]);
      }
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  } while( true );
}

Assistant:

TlsCertificate& TlsCertificate::operator=(const TlsCertificate& other) {
  for (auto i: kj::indices(chain)) {
    if (chain[i] != other.chain[i]) {
      EVP_PKEY_free(reinterpret_cast<EVP_PKEY*>(chain[i]));
      chain[i] = other.chain[i];
      if (chain[i] != nullptr) X509_up_ref(reinterpret_cast<X509*>(chain[i]));
    } else if (chain[i] == nullptr) {
      // end of both chains; quit early
      break;
    }
  }
  return *this;
}